

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

uint __thiscall
TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Reserve
          (TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *this,uint amount)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  PoolEntry *pPVar4;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar2 = uVar1 + amount;
  this->Count = uVar2;
  if (uVar1 < uVar2) {
    pPVar4 = this->Array + uVar1;
    lVar3 = (ulong)uVar2 - (ulong)uVar1;
    do {
      (pPVar4->Str).Chars = (char *)0x87e02c;
      pPVar4 = pPVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    FString::NullString.RefCount = FString::NullString.RefCount + amount;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}